

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O2

void poly_mul(POLY_MUL_SCRATCH *scratch,poly *r,poly *a,poly *b)

{
  short *psVar1;
  short *psVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  int iVar17;
  long lVar18;
  
  iVar17 = CRYPTO_is_AVX2_capable();
  if (iVar17 == 0) {
    poly_assert_normalized(a);
    poly_assert_normalized(b);
    poly_mul_vec_aux((vec_t *)scratch,(scratch->u).vec.scratch,(vec_t *)a,(vec_t *)b,0x58);
    for (lVar18 = 0; lVar18 != 0x580; lVar18 = lVar18 + 0x10) {
      sVar10 = *(short *)((long)&scratch->u + lVar18 + 0x57c);
      sVar11 = *(short *)((long)&scratch->u + lVar18 + 0x57e);
      psVar2 = (short *)((long)&scratch->u + lVar18 + 0x580);
      sVar13 = *psVar2;
      sVar14 = psVar2[1];
      sVar15 = psVar2[2];
      sVar16 = psVar2[3];
      sVar12 = psVar2[4];
      psVar2 = (short *)((long)&scratch->u + lVar18);
      sVar3 = psVar2[1];
      sVar4 = psVar2[2];
      sVar5 = psVar2[3];
      sVar6 = psVar2[4];
      sVar7 = psVar2[5];
      sVar8 = psVar2[6];
      sVar9 = psVar2[7];
      psVar1 = (short *)((long)&r->field_0 + lVar18);
      *psVar1 = *(short *)((long)&scratch->u + lVar18 + 0x57a) + *psVar2;
      psVar1[1] = sVar10 + sVar3;
      psVar1[2] = sVar11 + sVar4;
      psVar1[3] = sVar13 + sVar5;
      psVar1[4] = sVar14 + sVar6;
      psVar1[5] = sVar15 + sVar7;
      psVar1[6] = sVar16 + sVar8;
      psVar1[7] = sVar12 + sVar9;
    }
  }
  else {
    poly_Rq_mul(r,a,b,scratch);
  }
  (r->field_0).v[0x2bf] = 0;
  *(undefined4 *)((long)&r->field_0 + 0x57a) = 0;
  poly_assert_normalized(r);
  return;
}

Assistant:

static void poly_mul(struct POLY_MUL_SCRATCH *scratch, struct poly *r,
                     const struct poly *a, const struct poly *b) {
#if defined(POLY_RQ_MUL_ASM)
  if (CRYPTO_is_AVX2_capable()) {
    poly_Rq_mul(r->v, a->v, b->v, scratch->u.rq);
    poly_normalize(r);
  } else
#endif

#if defined(HRSS_HAVE_VECTOR_UNIT)
      if (vec_capable()) {
    poly_mul_vec(scratch, r, a, b);
  } else
#endif

  // Fallback, non-vector case.
  {
    poly_mul_novec(scratch, r, a, b);
  }

  poly_assert_normalized(r);
}